

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnSetFloat(XL *out,char *key,float value)

{
  XLearn *this;
  int iVar1;
  HyperParam *pHVar2;
  char *in_RSI;
  undefined8 *in_RDI;
  real_t in_XMM0_Da;
  runtime_error *_except_;
  XLearn *xl;
  
  this = (XLearn *)*in_RDI;
  iVar1 = strcmp(in_RSI,"lr");
  if (iVar1 == 0) {
    pHVar2 = XLearn::GetHyperParam(this);
    pHVar2->learning_rate = in_XMM0_Da;
  }
  else {
    iVar1 = strcmp(in_RSI,"lambda");
    if (iVar1 == 0) {
      pHVar2 = XLearn::GetHyperParam(this);
      pHVar2->regu_lambda = in_XMM0_Da;
    }
    else {
      iVar1 = strcmp(in_RSI,"init");
      if (iVar1 == 0) {
        pHVar2 = XLearn::GetHyperParam(this);
        pHVar2->model_scale = in_XMM0_Da;
      }
      else {
        iVar1 = strcmp(in_RSI,"alpha");
        if (iVar1 == 0) {
          pHVar2 = XLearn::GetHyperParam(this);
          pHVar2->alpha = in_XMM0_Da;
        }
        else {
          iVar1 = strcmp(in_RSI,"beta");
          if (iVar1 == 0) {
            pHVar2 = XLearn::GetHyperParam(this);
            pHVar2->beta = in_XMM0_Da;
          }
          else {
            iVar1 = strcmp(in_RSI,"lambda_1");
            if (iVar1 == 0) {
              pHVar2 = XLearn::GetHyperParam(this);
              pHVar2->lambda_1 = in_XMM0_Da;
            }
            else {
              iVar1 = strcmp(in_RSI,"lambda_2");
              if (iVar1 == 0) {
                pHVar2 = XLearn::GetHyperParam(this);
                pHVar2->lambda_2 = in_XMM0_Da;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetFloat(XL *out, const char *key, const float value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "lr") == 0) {
    xl->GetHyperParam().learning_rate = value;
  } else if (strcmp(key, "lambda") == 0) {
    xl->GetHyperParam().regu_lambda = value;
  } else if (strcmp(key, "init") == 0) {
    xl->GetHyperParam().model_scale = value;
  } else if (strcmp(key, "alpha") == 0) {
    xl->GetHyperParam().alpha = value;
  } else if (strcmp(key, "beta") == 0) {
    xl->GetHyperParam().beta = value;
  } else if (strcmp(key, "lambda_1") == 0) {
    xl->GetHyperParam().lambda_1 = value;
  } else if (strcmp(key, "lambda_2") == 0) {
    xl->GetHyperParam().lambda_2 = value;
  }
  API_END();
}